

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter_11.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *__return_storage_ptr__,string *str,string *delim)

{
  value_type local_a8;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> substr;
  size_type pos_1;
  uint pos;
  uint offset;
  string word;
  string *delim_local;
  string *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *words;
  
  word.field_2._8_8_ = delim;
  std::__cxx11::string::string((string *)&offset);
  memset(__return_storage_ptr__,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  substr.field_2._8_8_ = std::__cxx11::string::find((string *)str,word.field_2._8_8_);
  while (substr.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)local_78,(ulong)str);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_78);
    substr.field_2._8_8_ = std::__cxx11::string::find((string *)str,word.field_2._8_8_);
    std::__cxx11::string::~string((string *)local_78);
  }
  std::__cxx11::string::substr((ulong)&local_a8,(ulong)str);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&offset);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> split(const std::string& str, const std::string& delim)
{
	auto word = std::string{};
	auto words = std::vector<std::string>{};
	auto offset = 0u;
	auto pos = 0u;
	for (auto pos = str.find(delim, offset); pos != std::string::npos;)
	{
		auto substr = str.substr(offset, pos - offset);
		words.push_back(substr);
		offset = pos + 1;
		pos = str.find(delim, offset);
	}
	words.push_back(str.substr(offset, pos - offset));
	return words;
}